

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int solver2_analyze(sat_solver2 *s,clause *c,veci *learnt)

{
  int iVar1;
  int iVar2;
  lit lVar3;
  int *piVar4;
  int *piVar5;
  clause *cls;
  bool bVar6;
  int local_60;
  int local_5c;
  int max;
  int max_i;
  lit tmp;
  lit k;
  lit j;
  lit i;
  lit *vars;
  lit *lits;
  int local_30;
  int proof_id;
  int ind;
  int x;
  lit p;
  int cnt;
  veci *learnt_local;
  clause *c_local;
  sat_solver2 *s_local;
  
  x = 0;
  ind = 0;
  iVar2 = s->qtail;
  lits._4_4_ = 0;
  iVar1 = veci_size(&s->tagged);
  if (iVar1 != 0) {
    __assert_fail("veci_size(&s->tagged) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x313,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
  }
  proof_chain_start(s,c);
  veci_push(learnt,-2);
  local_30 = iVar2 + -1;
  learnt_local = (veci *)c;
  while( true ) {
    if (learnt_local == (veci *)0x0) {
      __assert_fail("c != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x31b,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
    }
    if ((learnt_local->cap & 1U) != 0) {
      act_clause2_bump(s,(clause *)learnt_local);
    }
    tmp = (lit)(0 < ind);
    while( true ) {
      bVar6 = false;
      if (tmp < (int)((uint)learnt_local->cap >> 0xb)) {
        proof_id = lit_var((&learnt_local->size)[tmp]);
        bVar6 = proof_id != 0;
      }
      iVar2 = local_30;
      if (!bVar6) break;
      if ((proof_id < 0) || (s->size <= proof_id)) {
        __assert_fail("x >= 0 && x < s->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,799,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
      }
      iVar2 = var_tag(s,proof_id);
      if (iVar2 == 0) {
        iVar2 = var_level(s,proof_id);
        if (iVar2 == 0) {
          proof_chain_resolve(s,(clause *)0x0,proof_id);
        }
        else {
          var_set_tag(s,proof_id,1);
          act_var_bump(s,proof_id);
          iVar2 = var_level(s,proof_id);
          iVar1 = solver2_dlevel(s);
          if (iVar2 == iVar1) {
            x = x + 1;
          }
          else {
            veci_push(learnt,(&learnt_local->size)[tmp]);
          }
        }
      }
      tmp = tmp + 1;
    }
    do {
      local_30 = iVar2;
      iVar2 = lit_var(s->trail[local_30]);
      iVar1 = var_tag(s,iVar2);
      iVar2 = local_30 + -1;
    } while (iVar1 == 0);
    ind = s->trail[local_30];
    iVar2 = lit_reason(s,ind);
    learnt_local = (veci *)clause2_read(s,iVar2);
    x = x + -1;
    if (x == 0) break;
    iVar2 = lit_var(ind);
    proof_chain_resolve(s,(clause *)learnt_local,iVar2);
    local_30 = local_30 + -1;
  }
  lVar3 = lit_neg(ind);
  piVar4 = veci_begin(learnt);
  *piVar4 = lVar3;
  iVar2 = veci_size(&s->mark_levels);
  if (iVar2 != 0) {
    __assert_fail("veci_size(&s->mark_levels) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x33b,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
  }
  piVar4 = veci_begin(learnt);
  for (k = 1; iVar2 = veci_size(learnt), k < iVar2; k = k + 1) {
    iVar2 = lit_var(piVar4[k]);
    var_lev_set_mark(s,iVar2);
  }
  veci_resize(&s->min_lit_order,0);
  tmp = 1;
  for (k = 1; iVar2 = veci_size(learnt), k < iVar2; k = k + 1) {
    iVar2 = lit_var(piVar4[k]);
    iVar2 = solver2_lit_removable_rec(s,iVar2);
    if (iVar2 == 0) {
      piVar4[tmp] = piVar4[k];
      tmp = tmp + 1;
    }
  }
  if (s->fProofLogging != 0) {
    veci_resize(&s->min_step_order,0);
    piVar5 = veci_begin(&s->min_lit_order);
    for (k = 0; iVar2 = veci_size(&s->min_lit_order), k < iVar2; k = k + 1) {
      solver2_logging_order_rec(s,piVar5[k]);
    }
    piVar5 = veci_begin(&s->min_step_order);
    k = veci_size(&s->min_step_order);
    while (0 < k) {
      k = k + -1;
      iVar2 = var_reason(s,piVar5[k]);
      cls = clause2_read(s,iVar2);
      proof_chain_resolve(s,cls,piVar5[k]);
      max_i = 1;
      while( true ) {
        bVar6 = false;
        if (max_i < (int)((uint)*cls >> 0xb)) {
          proof_id = lit_var((lit)cls[(long)max_i + 1]);
          bVar6 = proof_id != 0;
        }
        if (!bVar6) break;
        iVar2 = var_level(s,proof_id);
        if (iVar2 == 0) {
          proof_chain_resolve(s,(clause *)0x0,proof_id);
        }
        max_i = max_i + 1;
      }
    }
    lits._4_4_ = proof_chain_stop(s);
  }
  solver2_clear_marks(s);
  veci_resize(learnt,tmp);
  (s->stats).tot_literals = (long)tmp + (s->stats).tot_literals;
  solver2_clear_tags(s,0);
  iVar2 = veci_size(learnt);
  if (1 < iVar2) {
    local_5c = 1;
    iVar2 = lit_var(piVar4[1]);
    local_60 = var_level(s,iVar2);
    for (k = 2; iVar2 = veci_size(learnt), k < iVar2; k = k + 1) {
      iVar2 = lit_var(piVar4[k]);
      iVar2 = var_level(s,iVar2);
      if (local_60 < iVar2) {
        iVar2 = lit_var(piVar4[k]);
        local_60 = var_level(s,iVar2);
        local_5c = k;
      }
    }
    iVar2 = piVar4[1];
    piVar4[1] = piVar4[local_5c];
    piVar4[local_5c] = iVar2;
  }
  return lits._4_4_;
}

Assistant:

static int solver2_analyze(sat_solver2* s, clause* c, veci* learnt)
{
    int cnt      = 0;
    lit p        = 0;
    int x, ind   = s->qtail-1;
    int proof_id = 0;
    lit* lits,* vars, i, j, k;
    assert( veci_size(&s->tagged) == 0 );
    // tag[0] - visited by conflict analysis (afterwards: literals of the learned clause)
    // tag[1] - visited by solver2_lit_removable() with success
    // tag[2] - visited by solver2_logging_order()

    proof_chain_start( s, c );
    veci_push(learnt,lit_Undef);
    while ( 1 ){
        assert(c != 0);
        if (c->lrn)
            act_clause2_bump(s,c);
        clause_foreach_var( c, x, j, (int)(p > 0) ){
            assert(x >= 0 && x < s->size);
            if ( var_tag(s, x) )
                continue;
            if ( var_level(s,x) == 0 )
            {
                proof_chain_resolve( s, NULL, x );
                continue;
            }
            var_set_tag(s, x, 1);
            act_var_bump(s,x);
            if (var_level(s,x) == solver2_dlevel(s))
                cnt++;
            else
                veci_push(learnt,c->lits[j]);
        }

        while (!var_tag(s, lit_var(s->trail[ind--])));

        p = s->trail[ind+1];
        c = clause2_read(s, lit_reason(s,p));
        cnt--;
        if ( cnt == 0 )
            break;
        proof_chain_resolve( s, c, lit_var(p) );
    }
    *veci_begin(learnt) = lit_neg(p);

    // mark levels
    assert( veci_size(&s->mark_levels) == 0 );
    lits = veci_begin(learnt);
    for (i = 1; i < veci_size(learnt); i++)
        var_lev_set_mark(s, lit_var(lits[i]));

    // simplify (full)
    veci_resize(&s->min_lit_order, 0);
    for (i = j = 1; i < veci_size(learnt); i++){
//        if (!solver2_lit_removable( s,lit_var(lits[i])))
        if (!solver2_lit_removable_rec(s,lit_var(lits[i]))) // changed to vars!!!
            lits[j++] = lits[i];
    }

    // record the proof
    if ( s->fProofLogging )
    {
        // collect additional clauses to resolve
        veci_resize(&s->min_step_order, 0);
        vars = veci_begin(&s->min_lit_order);
        for (i = 0; i < veci_size(&s->min_lit_order); i++)
//            solver2_logging_order(s, vars[i]);
            solver2_logging_order_rec(s, vars[i]);

        // add them in the reverse order
        vars = veci_begin(&s->min_step_order);
        for (i = veci_size(&s->min_step_order); i > 0; ) { i--;
            c = clause2_read(s, var_reason(s,vars[i]));
            proof_chain_resolve( s, c, vars[i] );
            clause_foreach_var(c, x, k, 1)
                if ( var_level(s,x) == 0 )
                    proof_chain_resolve( s, NULL, x );
        }
        proof_id = proof_chain_stop( s );
    }

    // unmark levels
    solver2_clear_marks( s );

    // update size of learnt + statistics
    veci_resize(learnt,j);
    s->stats.tot_literals += j;

    // clear tags
    solver2_clear_tags(s,0);

#ifdef DEBUG
    for (i = 0; i < s->size; i++)
        assert(!var_tag(s, i));
#endif

#ifdef VERBOSEDEBUG
    Abc_Print(1,L_IND"Learnt {", L_ind);
    for (i = 0; i < veci_size(learnt); i++) Abc_Print(1," "L_LIT, L_lit(lits[i]));
#endif
    if (veci_size(learnt) > 1){
        lit tmp;
        int max_i = 1;
        int max   = var_level(s, lit_var(lits[1]));
        for (i = 2; i < veci_size(learnt); i++)
            if (max < var_level(s, lit_var(lits[i]))) {
                max = var_level(s, lit_var(lits[i]));
                max_i = i;
            }

        tmp         = lits[1];
        lits[1]     = lits[max_i];
        lits[max_i] = tmp;
    }
#ifdef VERBOSEDEBUG
    {
        int lev = veci_size(learnt) > 1 ? var_level(s, lit_var(lits[1])) : 0;
        Abc_Print(1," } at level %d\n", lev);
    }
#endif
    return proof_id;
}